

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

void pbrt::ErrorExit(FileLoc *loc,char *message)

{
  char *in_stack_000000a0;
  FileLoc *in_stack_000000a8;
  char *in_stack_000000b0;
  
  processError(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  DisconnectFromDisplayServer();
  quick_exit(1);
  __errno_location();
  return;
}

Assistant:

void ErrorExit(const FileLoc *loc, const char *message) {
    processError("Error", loc, message);
    DisconnectFromDisplayServer();
#ifdef PBRT_IS_OSX
    exit(1);
#else
    std::quick_exit(1);
#endif
}